

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O2

MethodHandle * __thiscall
jsonrpccxx::methodHandle<float,float,float>
          (MethodHandle *__return_storage_ptr__,jsonrpccxx *this,
          function<float_(float,_float)> *method)

{
  function<float_(float,_float)> local_30;
  
  std::function<float_(float,_float)>::function(&local_30,(function<float_(float,_float)> *)this);
  createMethodHandle<float,float,float,0ul,1ul>(__return_storage_ptr__,(jsonrpccxx *)&local_30);
  std::_Function_base::~_Function_base(&local_30.super__Function_base);
  return __return_storage_ptr__;
}

Assistant:

MethodHandle methodHandle(std::function<ReturnType(ParamTypes...)> method) {
    return createMethodHandle(method, std::index_sequence_for<ParamTypes...>{});
  }